

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatConstantTexture *
pbrt::FloatConstantTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  FloatConstantTexture *pFVar1;
  polymorphic_allocator<std::byte> *in_RSI;
  Float FVar2;
  string *in_stack_ffffffffffffff78;
  TextureParameterDictionary *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  FVar2 = TextureParameterDictionary::GetOneFloat
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0.0);
  pFVar1 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::FloatConstantTexture,float>
                     (in_RSI,(float *)CONCAT44(FVar2,in_stack_ffffffffffffff88));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return pFVar1;
}

Assistant:

FloatConstantTexture *FloatConstantTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    return alloc.new_object<FloatConstantTexture>(parameters.GetOneFloat("value", 1.f));
}